

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void Cmd_dumplinktable(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int x;
  int iVar2;
  int y;
  int iVar3;
  
  iVar2 = 1;
  while( true ) {
    if (Displacements.size <= iVar2) break;
    for (iVar3 = 1; iVar3 < Displacements.size; iVar3 = iVar3 + 1) {
      iVar1 = Displacements.size * iVar3 + iVar2;
      Printf("%c%c(%6d, %6d)",0x1c,(ulong)(Displacements.data.Array[iVar1].indirect + 0x43),
             (ulong)(uint)(int)Displacements.data.Array[iVar1].pos.X,
             (ulong)(uint)(int)Displacements.data.Array[iVar1].pos.Y);
    }
    Printf("\n");
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

CCMD(dumplinktable)
{
	for (int x = 1; x < Displacements.size; x++)
	{
		for (int y = 1; y < Displacements.size; y++)
		{
			FDisplacement &disp = Displacements(x, y);
			Printf("%c%c(%6d, %6d)", TEXTCOLOR_ESCAPE, 'C' + disp.indirect, int(disp.pos.X), int(disp.pos.Y));
		}
		Printf("\n");
	}
}